

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

double * __thiscall Graph::getLosses(Graph *this)

{
  double *pdVar1;
  Vertex *pVVar2;
  Edge *pEVar3;
  double dVar4;
  double dVar5;
  
  pdVar1 = (double *)operator_new__(0x10);
  *pdVar1 = 0.0;
  pdVar1[1] = 0.0;
  for (pVVar2 = this->verticesList; pVVar2 != (Vertex *)0x0; pVVar2 = pVVar2->nextVertex) {
    pEVar3 = pVVar2->edgesList;
    if (pEVar3 != (Edge *)0x0) {
      dVar5 = *pdVar1;
      dVar4 = pdVar1[1];
      do {
        dVar5 = dVar5 + pEVar3->activeLoss;
        dVar4 = dVar4 + pEVar3->reactiveLoss;
        pEVar3 = pEVar3->nextEdge;
      } while (pEVar3 != (Edge *)0x0);
      *pdVar1 = dVar5;
      pdVar1[1] = dVar4;
    }
  }
  return pdVar1;
}

Assistant:

double * Graph::getLosses(){
    double *loss = new double[2];
    loss[0] = 0.0;
    loss[1] = 0.0;
    for(Vertex *v=verticesList; v!=NULL; v = v->getNext()){
        for(Edge *e = v->getEdgesList(); e!=NULL; e = e->getNext()){
            loss[0] += e->getActiveLoss();
            loss[1] += e->getReactiveLoss();
        }
    }
    return loss;
}